

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

FTextureID gl_GetSpriteFrame(uint sprite,int frame,int rot,angle_t ang,bool *mirror)

{
  spriteframe_t *psVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  psVar1 = SpriteFrames.Array;
  iVar2 = 0;
  if (frame < (int)(uint)sprites.Array[sprite].numframes) {
    lVar4 = (long)frame + (ulong)sprites.Array[sprite].spriteframes;
    if (rot == -1) {
      if (SpriteFrames.Array[lVar4].Texture[0].texnum == SpriteFrames.Array[lVar4].Texture[1].texnum
         ) {
        uVar3 = ang + 0x90000000;
      }
      else {
        uVar3 = ang + 0x88000000;
      }
      rot = uVar3 >> 0x1c;
    }
    if (mirror != (bool *)0x0) {
      *mirror = (SpriteFrames.Array[lVar4].Flip >> (rot & 0x1fU) & 1) != 0;
    }
    iVar2 = psVar1[lVar4].Texture[rot].texnum;
  }
  return (FTextureID)iVar2;
}

Assistant:

FTextureID gl_GetSpriteFrame(unsigned sprite, int frame, int rot, angle_t ang, bool *mirror)
{
	spritedef_t *sprdef = &sprites[sprite];
	if (frame >= sprdef->numframes)
	{
		// If there are no frames at all for this sprite, don't draw it.
		return FNullTextureID();
	}
	else
	{
		//picnum = SpriteFrames[sprdef->spriteframes + thing->frame].Texture[0];
		// choose a different rotation based on player view
		spriteframe_t *sprframe = &SpriteFrames[sprdef->spriteframes + frame];
		if (rot==-1)
		{
			if (sprframe->Texture[0] == sprframe->Texture[1])
			{
				rot = (ang + (angle_t)(ANGLE_90/4)*9) >> 28;
			}
			else
			{
				rot = (ang + (angle_t)(ANGLE_90/4)*9-(angle_t)(ANGLE_180/16)) >> 28;
			}
		}
		if (mirror) *mirror = !!(sprframe->Flip&(1<<rot));
		return sprframe->Texture[rot];
	}
}